

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O0

uint __thiscall iqxmlrpc::http::Header::content_length(Header *this)

{
  bool bVar1;
  uint uVar2;
  Length_required *this_00;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  Header *local_10;
  Header *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"content-length",&local_31)
  ;
  bVar1 = option_exists(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"content-length",&local_69);
    uVar2 = get_unsigned(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    return uVar2;
  }
  this_00 = (Length_required *)__cxa_allocate_exception(0x50);
  Length_required::Length_required(this_00);
  __cxa_throw(this_00,&Length_required::typeinfo,Length_required::~Length_required);
}

Assistant:

unsigned Header::content_length() const
{
  if (!option_exists(names::content_length))
    throw Length_required();

  return get_unsigned(names::content_length);
}